

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaching-definitions-transfer-function.h
# Opt level: O0

void __thiscall
wasm::analysis::ReachingDefinitionsTransferFunction::visitLocalGet
          (ReachingDefinitionsTransferFunction *this,LocalGet *curr)

{
  bool bVar1;
  mapped_type *this_00;
  value_type *ppLVar2;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar3;
  LocalSet *local_68;
  _Node_iterator_base<wasm::LocalSet_*,_false> local_60;
  _Node_iterator_base<wasm::LocalSet_*,_false> local_58;
  LocalSet *local_50;
  value_type setInstance;
  Iterator __end3;
  Iterator __begin3;
  mapped_type *__range3;
  mapped_type *matchingSets;
  LocalGet *curr_local;
  ReachingDefinitionsTransferFunction *this_local;
  
  matchingSets = (mapped_type *)curr;
  curr_local = (LocalGet *)this;
  if ((this->
      super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
      ).currState == (Element *)0x0) {
    __assert_fail("currState",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/reaching-definitions-transfer-function.h"
                  ,0x78,
                  "void wasm::analysis::ReachingDefinitionsTransferFunction::visitLocalGet(LocalGet *)"
                 );
  }
  if (((this->
       super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
       ).collectingResults & 1U) != 0) {
    this_00 = std::
              unordered_map<unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>_>_>
              ::operator[](&this->indexSetses,&curr->index);
    join_0x00000010_0x00000000_ =
         (IteratorBase<wasm::SmallVector<wasm::LocalSet_*,_2UL>,_wasm::SmallVector<wasm::LocalSet_*,_2UL>::Iterator>
          )SmallVector<wasm::LocalSet_*,_2UL>::begin(this_00);
    _setInstance = (IteratorBase<wasm::SmallVector<wasm::LocalSet_*,_2UL>,_wasm::SmallVector<wasm::LocalSet_*,_2UL>::Iterator>
                    )SmallVector<wasm::LocalSet_*,_2UL>::end(this_00);
    while (bVar1 = SmallVector<wasm::LocalSet_*,_2UL>::
                   IteratorBase<wasm::SmallVector<wasm::LocalSet_*,_2UL>,_wasm::SmallVector<wasm::LocalSet_*,_2UL>::Iterator>
                   ::operator!=((IteratorBase<wasm::SmallVector<wasm::LocalSet_*,_2UL>,_wasm::SmallVector<wasm::LocalSet_*,_2UL>::Iterator>
                                 *)&__end3.
                                    super_IteratorBase<wasm::SmallVector<wasm::LocalSet_*,_2UL>,_wasm::SmallVector<wasm::LocalSet_*,_2UL>::Iterator>
                                    .index,(Iterator *)&setInstance), bVar1) {
      ppLVar2 = SmallVector<wasm::LocalSet_*,_2UL>::Iterator::operator*
                          ((Iterator *)
                           &__end3.
                            super_IteratorBase<wasm::SmallVector<wasm::LocalSet_*,_2UL>,_wasm::SmallVector<wasm::LocalSet_*,_2UL>::Iterator>
                            .index);
      local_50 = *ppLVar2;
      bVar1 = FinitePowersetLattice<wasm::LocalSet_*>::exists
                        (&this->lattice,
                         (this->
                         super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
                         ).currState,local_50);
      if (bVar1) {
        local_58._M_cur =
             (__node_type *)
             std::
             unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
             ::find(&this->fakeSetPtrs,&local_50);
        local_60._M_cur =
             (__node_type *)
             std::
             unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
             ::end(&this->fakeSetPtrs);
        bVar1 = std::__detail::operator==(&local_58,&local_60);
        if (bVar1) {
          pSVar3 = &std::
                    unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                    ::operator[](this->getSetsMap,(key_type *)&matchingSets)->
                    super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ;
          SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ::insert(pSVar3,&local_50);
        }
        else {
          pSVar3 = &std::
                    unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                    ::operator[](this->getSetsMap,(key_type *)&matchingSets)->
                    super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ;
          local_68 = (LocalSet *)0x0;
          SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ::insert(pSVar3,&local_68);
        }
      }
      SmallVector<wasm::LocalSet_*,_2UL>::
      IteratorBase<wasm::SmallVector<wasm::LocalSet_*,_2UL>,_wasm::SmallVector<wasm::LocalSet_*,_2UL>::Iterator>
      ::operator++((IteratorBase<wasm::SmallVector<wasm::LocalSet_*,_2UL>,_wasm::SmallVector<wasm::LocalSet_*,_2UL>::Iterator>
                    *)&__end3.
                       super_IteratorBase<wasm::SmallVector<wasm::LocalSet_*,_2UL>,_wasm::SmallVector<wasm::LocalSet_*,_2UL>::Iterator>
                       .index);
    }
  }
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    assert(currState);

    // This is only to be run in the second phase where we iterate over the
    // final (i.e. solved) states. Thus, only done when collectingResults is
    // true.
    if (collectingResults) {
      auto& matchingSets = indexSetses[curr->index];

      for (auto setInstance : matchingSets) {
        if (lattice.exists(currState, setInstance)) {
          // If a pointer to a real LocalSet, add it, otherwise add a nullptr.
          if (fakeSetPtrs.find(setInstance) == fakeSetPtrs.end()) {
            getSetsMap[curr].insert(setInstance);
          } else {
            getSetsMap[curr].insert(nullptr);
          }
        }
      }
    }
  }